

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

void __thiscall nuraft::buffer_serializer::put_cstr(buffer_serializer *this,char *str)

{
  size_t sVar1;
  byte *pbVar2;
  overflow_error *poVar3;
  long in_RSI;
  long in_RDI;
  size_t ii;
  char *ptr;
  size_t buf_size;
  size_t local_pos;
  size_t in_stack_ffffffffffffffc8;
  buffer_serializer *this_00;
  ulong local_18;
  
  local_18 = *(ulong *)(in_RDI + 0x10);
  sVar1 = nuraft::buffer::size(*(buffer **)(in_RDI + 8));
  pbVar2 = nuraft::buffer::data_begin(*(buffer **)(in_RDI + 8));
  this_00 = (buffer_serializer *)0x0;
  while( true ) {
    if (*(char *)((long)&this_00->endian_ + in_RSI) == '\0') {
      if (sVar1 <= local_18) {
        poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(poVar3,"not enough space");
        __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
      }
      pbVar2[local_18] = '\0';
      pos(this_00,in_stack_ffffffffffffffc8);
      return;
    }
    if (sVar1 <= local_18) break;
    pbVar2[local_18] = *(byte *)((long)&this_00->endian_ + in_RSI);
    local_18 = local_18 + 1;
    this_00 = (buffer_serializer *)((long)&this_00->endian_ + 1);
  }
  poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(poVar3,"not enough space");
  __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer_serializer::put_cstr(const char* str) {
    size_t local_pos = pos_;
    size_t buf_size = buf_.size();
    char* ptr = (char*)buf_.data_begin();

    size_t ii = 0;
    while (str[ii] != 0x0) {
        if (local_pos >= buf_size) {
            throw std::overflow_error("not enough space");
        }
        ptr[local_pos] = str[ii];
        local_pos++;
        ii++;
    }
    // Put NULL character at the end.
    if (local_pos >= buf_size) {
        throw std::overflow_error("not enough space");
    }
    ptr[local_pos++] = 0x0;
    pos( local_pos );
}